

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

re_status_t re_compile(re_context *ctx,char *expr,size_t exprlen,re_machine *result_machine)

{
  byte *pbVar1;
  uchar *puVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  re_state_id dest_id;
  re_state_id id;
  undefined4 id_00;
  undefined4 dest_id_00;
  byte bVar6;
  uchar *puVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  re_machine new_machine;
  re_machine cur_machine;
  re_machine alter_machine;
  uchar set [32];
  anon_struct_20_3_53c8f05c group_stack [50];
  uint uVar12;
  
  re_reset(ctx);
  cur_machine.init = -1;
  cur_machine.final = -1;
  alter_machine.init = -1;
  alter_machine.final = -1;
  uVar10 = 0;
  do {
    if (exprlen == 0) {
      re_alternate_onto(ctx,&alter_machine,&cur_machine);
      *result_machine = alter_machine;
      return RE_STATUS_SUCCESS;
    }
    bVar9 = *expr;
    switch(bVar9) {
    case 0x24:
      if (((exprlen != 1) && (((byte *)expr)[1] != 0x7c)) && (((byte *)expr)[1] != 0x29))
      goto switchD_0012f007_caseD_26;
      re_build_char(ctx,&new_machine,'\x04');
      goto LAB_0012f582;
    case 0x25:
      exprlen = exprlen - 1;
      if (exprlen == 0) {
        exprlen = 1;
        break;
      }
      expr = (char *)((byte *)expr + 1);
      bVar9 = *expr;
      switch(bVar9) {
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        re_init_machine(ctx,&new_machine);
        re_set_trans(ctx,new_machine.init,new_machine.final,bVar9 - 0x24);
        goto LAB_0012f491;
      case 0x3a:
      case 0x3b:
      case 0x3d:
      case 0x3f:
      case 0x40:
      case 0x41:
switchD_0012f175_caseD_3a:
        goto LAB_0012f487;
      case 0x3c:
        cVar4 = '\x05';
        break;
      case 0x3e:
        cVar4 = '\x06';
        break;
      case 0x42:
        cVar4 = '\n';
        break;
      default:
        if (bVar9 == 0x57) {
          bVar9 = 8;
        }
        else {
          if (bVar9 == 0x62) {
            cVar4 = '\t';
            break;
          }
          if (bVar9 != 0x77) goto switchD_0012f175_caseD_3a;
          bVar9 = 7;
        }
LAB_0012f487:
        re_build_char(ctx,&new_machine,bVar9);
        goto LAB_0012f491;
      }
      re_build_char(ctx,&new_machine,cVar4);
      re_concat_onto(ctx,&cur_machine,&new_machine);
      break;
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
switchD_0012f007_caseD_26:
      goto LAB_0012f1a7;
    case 0x28:
      if (0x32 < uVar10) {
        return RE_STATUS_GROUP_NESTING_TOO_DEEP;
      }
      group_stack[uVar10].old_cur = cur_machine;
      group_stack[uVar10].old_alter = alter_machine;
      iVar3 = ctx->cur_group;
      group_stack[uVar10].group_id = iVar3;
      ctx->cur_group = iVar3 + 1;
      cur_machine.init = -1;
      cur_machine.final = -1;
      uVar10 = uVar10 + 1;
      alter_machine.init = -1;
      alter_machine.final = -1;
      break;
    case 0x29:
      if (uVar10 == 0) {
        uVar10 = 0;
        break;
      }
      uVar10 = uVar10 - 1;
      re_alternate_onto(ctx,&alter_machine,&cur_machine);
      cVar4 = (char)group_stack[uVar10].group_id;
      re_init_machine(ctx,&new_machine);
      lVar14 = (long)new_machine.init;
      re_set_trans(ctx,new_machine.init,alter_machine.init,'\x01');
      lVar15 = (long)new_machine.final;
      re_set_trans(ctx,alter_machine.final,new_machine.final,'\x01');
      puVar2 = &ctx->tuple_arr[lVar14].flags;
      *puVar2 = *puVar2 | 2;
      puVar2 = &ctx->tuple_arr[lVar15].flags;
      *puVar2 = *puVar2 | 4;
      ctx->tuple_arr[lVar14].ch = cVar4;
      ctx->tuple_arr[lVar15].ch = cVar4;
      cur_machine = group_stack[uVar10].old_cur;
      alter_machine = group_stack[uVar10].old_alter;
      goto LAB_0012f491;
    case 0x2e:
      bVar9 = 2;
LAB_0012f1a7:
      re_build_char(ctx,&new_machine,bVar9);
LAB_0012f491:
      if (1 < exprlen) {
        bVar9 = ((byte *)expr)[1];
        if (((ulong)bVar9 < 0x40) && ((0x80000c0000000000U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) {
          re_init_machine(ctx,(re_machine *)set);
          id_00 = set._0_4_;
          dest_id = new_machine.init;
          re_set_trans(ctx,set._0_4_,new_machine.init,'\x01');
          id = new_machine.final;
          dest_id_00 = set._4_4_;
          re_set_trans(ctx,new_machine.final,set._4_4_,'\x01');
          if ((bVar9 == 0x3f) || (re_set_trans(ctx,id,dest_id,'\x01'), bVar9 != 0x2b)) {
            re_set_trans(ctx,id_00,dest_id_00,'\x01');
          }
          new_machine = (re_machine)set._0_8_;
          pbVar13 = (byte *)expr;
          do {
            exprlen = exprlen - 1;
            expr = (char *)(pbVar13 + 1);
            if ((exprlen < 2) || (pbVar1 = pbVar13 + 2, 0x3f < (ulong)*pbVar1)) break;
            pbVar13 = (byte *)expr;
          } while ((0x80000c0000000000U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0);
        }
      }
LAB_0012f582:
      re_concat_onto(ctx,&cur_machine,&new_machine);
      break;
    default:
      if (bVar9 == 0x5b) {
        set[0x10] = '\0';
        set[0x11] = '\0';
        set[0x12] = '\0';
        set[0x13] = '\0';
        set[0x14] = '\0';
        set[0x15] = '\0';
        set[0x16] = '\0';
        set[0x17] = '\0';
        set[0x18] = '\0';
        set[0x19] = '\0';
        set[0x1a] = '\0';
        set[0x1b] = '\0';
        set[0x1c] = '\0';
        set[0x1d] = '\0';
        set[0x1e] = '\0';
        set[0x1f] = '\0';
        set[0] = '\0';
        set[1] = '\0';
        set[2] = '\0';
        set[3] = '\0';
        set[4] = '\0';
        set[5] = '\0';
        set[6] = '\0';
        set[7] = '\0';
        set[8] = '\0';
        set[9] = '\0';
        set[10] = '\0';
        set[0xb] = '\0';
        set[0xc] = '\0';
        set[0xd] = '\0';
        set[0xe] = '\0';
        set[0xf] = '\0';
        pbVar13 = (byte *)expr + 1;
        uVar8 = exprlen - 1;
        if (uVar8 == 0) {
          bVar5 = false;
          uVar8 = 0;
        }
        else {
          bVar9 = *pbVar13;
          bVar5 = false;
          if (bVar9 == 0x5e) {
            pbVar13 = (byte *)expr + 2;
            uVar8 = exprlen - 2;
            if (uVar8 == 0) {
              bVar5 = true;
              uVar8 = 0;
              goto LAB_0012f38e;
            }
            bVar9 = *pbVar13;
            bVar5 = true;
          }
          if (bVar9 == 0x5d) {
            set[8] = '\0';
            set[9] = '\0';
            set[10] = '\0';
            set[0xb] = ' ';
            set[0xc] = '\0';
            set[0xd] = '\0';
            set[0xe] = '\0';
            set[0xf] = '\0';
            pbVar13 = pbVar13 + 1;
            uVar8 = uVar8 - 1;
            if (uVar8 == 0) {
              uVar8 = 0;
              goto LAB_0012f38e;
            }
            bVar9 = *pbVar13;
          }
          if (bVar9 == 0x2d) {
            set[0] = '\0';
            set[1] = '\0';
            set[2] = '\0';
            set[3] = '\0';
            set[4] = '\0';
            set[5] = ' ';
            set[6] = '\0';
            set[7] = '\0';
            pbVar13 = pbVar13 + 1;
            uVar8 = uVar8 - 1;
          }
        }
LAB_0012f38e:
        while ((exprlen = uVar8, expr = (char *)pbVar13, exprlen != 0 &&
               (bVar9 = *expr, bVar9 != 0x5d))) {
          set[bVar9 >> 3] = set[bVar9 >> 3] | '\x01' << (bVar9 & 7);
          pbVar13 = (byte *)expr + 1;
          uVar8 = 0;
          if ((exprlen - 1 != 0) && (uVar8 = exprlen - 1, *pbVar13 == 0x2d)) {
            pbVar13 = (byte *)expr + 2;
            uVar8 = 0;
            if (exprlen != 2) {
              bVar11 = ((byte *)expr)[2];
              bVar6 = bVar11;
              if (bVar11 < bVar9) {
                bVar6 = bVar9;
              }
              if (bVar9 < bVar11) {
                bVar11 = bVar9;
              }
              for (uVar12 = (uint)bVar11; uVar12 <= bVar6; uVar12 = uVar12 + 1) {
                set[uVar12 >> 3] = set[uVar12 >> 3] | (byte)(1 << ((byte)uVar12 & 7));
              }
              pbVar13 = (byte *)expr + 3;
              uVar8 = exprlen - 3;
            }
          }
        }
        re_init_machine(ctx,&new_machine);
        lVar14 = (long)new_machine.init;
        re_set_trans(ctx,new_machine.init,new_machine.final,'\f' - !bVar5);
        puVar7 = mchalo(ctx->errctx,0x20,"regex range");
        *(undefined8 *)puVar7 = set._0_8_;
        *(undefined8 *)(puVar7 + 8) = set._8_8_;
        *(undefined8 *)(puVar7 + 0x10) = set._16_8_;
        *(undefined8 *)(puVar7 + 0x18) = set._24_8_;
        ctx->tuple_arr[lVar14].char_range = puVar7;
        goto LAB_0012f491;
      }
      if (bVar9 != 0x7c) {
        if ((bVar9 == 0x5e) && (cur_machine.init == -1)) {
          re_build_char(ctx,&new_machine,'\x03');
          goto LAB_0012f582;
        }
        goto switchD_0012f007_caseD_26;
      }
      re_alternate_onto(ctx,&alter_machine,&cur_machine);
      cur_machine.init = -1;
      cur_machine.final = -1;
    }
    expr = (char *)((byte *)expr + 1);
    exprlen = exprlen - 1;
  } while( true );
}

Assistant:

static re_status_t re_compile(re_context *ctx,
                              const char *expr, size_t exprlen,
                              re_machine *result_machine)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    size_t group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
    } group_stack[50];

    /* reset everything */
    re_reset(ctx);

    /* start out with no current machine and no alternate machine */
    re_build_null_machine(ctx, &cur_machine);
    re_build_null_machine(ctx, &alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for ( ; exprlen != 0 ; ++expr, --exprlen)
    {
        switch(*expr)
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!re_is_machine_null(ctx, &cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_BEGIN);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, great it as a normal character 
             */
            if (exprlen > 1
                && (*(expr+1) != ')' && *(expr+1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_END);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
            
        case '(':
            /* 
             *   Add a nesting level.  Push the current machine and
             *   alternate machines onto the group stack, and clear
             *   everything out for the new group. 
             */
            if (group_stack_level
                > sizeof(group_stack)/sizeof(group_stack[0]))
            {
                /* we cannot proceed - return an error */
                return RE_STATUS_GROUP_NESTING_TOO_DEEP;
            }

            /* save the current state on the stack */
            group_stack[group_stack_level].old_cur = cur_machine;
            group_stack[group_stack_level].old_alter = alter_machine;

            /* 
             *   Assign the group a group ID - groups are numbered in
             *   order of their opening (left) parentheses, so we want to
             *   assign a group number now.  We won't actually need to
             *   know the group number until we get to the matching close
             *   paren, but we need to assign it now, so store it in the
             *   group stack. 
             */
            group_stack[group_stack_level].group_id = ctx->cur_group;

            /* consume the group number */
            ctx->cur_group++;

            /* push the level */
            ++group_stack_level;

            /* start the new group with empty machines */
            re_build_null_machine(ctx, &cur_machine);
            re_build_null_machine(ctx, &alter_machine);
            break;

        case ')':
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.  
             */
            re_build_group(ctx, &new_machine, &alter_machine,
                           group_stack[group_stack_level].group_id);

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            re_build_null_machine(ctx, &cur_machine);
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            ++expr;
            --exprlen;

            /* check to see if we're at the end of the expression */
            if (exprlen == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                --expr;
                ++exprlen;
                break;
            }

            /* see what we have */
            switch(*expr)
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                re_build_group_matcher(ctx, &new_machine, (int)(*expr - '1'));

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_BEGIN);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_END);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                re_build_char(ctx, &new_machine, RE_WORD_CHAR);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                re_build_char(ctx, &new_machine, RE_NON_WORD_CHAR);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                re_build_char(ctx, &new_machine, RE_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                re_build_char(ctx, &new_machine, RE_NON_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            default:
                /* build a new literal character recognizer */
                re_build_char(ctx, &new_machine, *expr);

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            re_build_char(ctx, &new_machine, RE_WILDCARD);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;
                unsigned char set[32];

                /* clear out the set of characters in the range */
                memset(set, 0, sizeof(set));

                /* first, skip the open bracket */
                ++expr;
                --exprlen;

                /* check to see if starts with the exclusion character */
                if (exprlen != 0 && *expr == '^')
                {
                    /* skip the exclusion specifier */
                    ++expr;
                    --exprlen;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == ']')
                {
                    re_set_bit(set, (int)']');
                    ++expr;
                    --exprlen;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == '-')
                {
                    re_set_bit(set, (int)'-');
                    ++expr;
                    --exprlen;
                }

                /* scan the character set */
                while (exprlen != 0 && *expr != ']')
                {
                    int ch;
                    
                    /* note this character */
                    ch = (int)(unsigned char)*expr;

                    /* set it */
                    re_set_bit(set, ch);

                    /* skip this character of the expression */
                    ++expr;
                    --exprlen;

                    /* check for a range */
                    if (exprlen != 0 && *expr == '-')
                    {
                        int ch2;
                        
                        /* skip the '-' */
                        ++expr;
                        --exprlen;
                        if (exprlen != 0)
                        {
                            /* get the other end of the range */
                            ch2 = (int)(unsigned char)*expr;

                            /* skip the second character */
                            ++expr;
                            --exprlen;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                int tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* fill in the range */
                            for ( ; ch <= ch2 ; ++ch)
                                re_set_bit(set, ch);
                        }
                    }
                }

                /* create a character range machine */
                re_build_char_range(ctx, &new_machine, set, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            re_build_char(ctx, &new_machine, *expr);

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprlen > 1)
            {
                switch(*(expr+1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        re_machine closure_machine;
                        
                        /* move onto the closure operator */
                        ++expr;
                        --exprlen;
                        
                        /* build the closure machine */
                        re_build_closure(ctx, &closure_machine,
                                         &new_machine, *expr);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                        
                        /* 
                         *   skip any redundant closure symbols, keeping
                         *   only the first one we saw 
                         */
                        while (exprlen > 1 && (*(expr+1) == '?'
                                               || *(expr+1) == '+'
                                               || *(expr+1) == '*'))
                        {
                            ++expr;
                            --exprlen;
                        }
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
        }
    }

    /* complete any pending alternation */
    re_alternate_onto(ctx, &alter_machine, &cur_machine);

    /* store the resulting machine in the caller's machine descriptor */
    *result_machine = alter_machine;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}